

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tester.h
# Opt level: O2

void __thiscall
density_tests::
QueueGenericTester<density::lf_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::ThreadData::put_one(ThreadData *this)

{
  int64_t iVar1;
  anon_class_16_2_42c33408 put_func;
  unsigned_long type_index;
  anon_class_16_2_42c33408 local_40;
  unsigned_long local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_30 = EasyRandom::get_int<unsigned_long>
                       ((EasyRandom *)(this + 0x50),
                        (*(long *)(*(long *)(this + 8) + 0x48) -
                         *(long *)(*(long *)(this + 8) + 0x40) >> 3) - 1);
  local_40.type_index = &local_30;
  local_40.this = (ThreadData *)this;
  if (((byte)this[0x10] & 2) == 0) {
    put_one::anon_class_16_2_42c33408::operator()(&local_40);
  }
  else {
    local_10 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:513:33)>
               ::_M_invoke;
    local_18 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/../../test_framework/queue_generic_tester.h:513:33)>
               ::_M_manager;
    local_28._M_unused._0_8_ = (undefined8)this;
    local_28._8_8_ = local_40.type_index;
    iVar1 = run_exception_test((function<void_()> *)&local_28);
    *(long *)(this + 0x38) = *(long *)(this + 0x38) + iVar1;
    std::_Function_base::~_Function_base((_Function_base *)&local_28);
  }
  return;
}

Assistant:

void put_one()
            {
                /* pick a random type (outside the exception loop) to have a deterministic and exhaustive
                    exception test at least in isolation (in single-thread tests). */
                const auto type_index =
                  m_random.get_int<size_t>(m_parent_tester.m_put_cases.size() - 1);

                auto put_func = [&] {
                    if (m_random.get_bool())
                    {
                        bool put_done =
                          (*m_parent_tester.m_put_cases[type_index])(m_queue, m_random);
                        if (put_done)
                        {
                            // done! From now on no exception can occur
                            auto & counters = m_final_stats.m_counters[type_index];
                            counters.m_existing++;
                            counters.m_spawned++;

                            m_put_committed++;
                        }
                    }
                    else
                    {
                        auto transaction =
                          (*m_parent_tester.m_reentrant_put_cases[type_index])(m_queue, m_random);
                        if (transaction)
                        {
                            m_pending_reentrant_puts.push_back(
                              ReentrantPut(type_index, std::move(transaction)));
                        }
                    }
                };

                if (
                  (m_flags & QueueTesterFlags::eTestExceptions) ==
                  QueueTesterFlags::eTestExceptions)
                {
                    m_final_stats.m_exceptions_during_puts += run_exception_test(put_func);
                }
                else
                {
                    put_func();
                }
            }